

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_load_file(uchar **out,size_t *outsize,char *filename)

{
  FILE *__stream;
  char *in_RDX;
  FILE *file;
  uint error;
  FILE *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  uint local_4;
  
  __stream = fopen(in_RDX,"rb");
  if (__stream == (FILE *)0x0) {
    local_4 = 0x4e;
  }
  else {
    local_4 = lodepng_load_file_((uchar **)
                                 CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                                 (size_t *)__stream,in_stack_ffffffffffffffc8);
    fclose(__stream);
  }
  return local_4;
}

Assistant:

unsigned lodepng_load_file(unsigned char** out, size_t* outsize, const char* filename) {
  unsigned error;
  FILE* file = fopen(filename, "rb");
  if(!file) return 78;
  error = lodepng_load_file_(out, outsize, file);
  fclose(file);
  return error;
}